

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void idtx32x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  __m256i alVar4;
  
  lVar1 = (long)instride;
  lVar2 = (long)outstride;
  uVar3 = 0xfffffffffffffff8;
  do {
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])*input,2);
    *output = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1],2);
    output[lVar2] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 2],2);
    output[lVar2 * 2] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 3],2);
    output[lVar2 * 3] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 4],2);
    output[lVar2 * 4] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 5],2);
    output[lVar2 * 5] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 6],2);
    output[lVar2 * 6] = alVar4;
    alVar4 = (__m256i)vpslld_avx2((undefined1  [32])input[lVar1 * 7],2);
    output[lVar2 * 7] = alVar4;
    uVar3 = uVar3 + 8;
    output = output + lVar2 * 8;
    input = input + lVar1 * 8;
  } while (uVar3 < 0x18);
  return;
}

Assistant:

static inline void idtx32x32_avx2(__m256i *input, __m256i *output,
                                  const int8_t cos_bit, int instride,
                                  int outstride) {
  (void)cos_bit;
  for (int i = 0; i < 32; i += 8) {
    output[i * outstride] = _mm256_slli_epi32(input[i * instride], 2);
    output[(i + 1) * outstride] =
        _mm256_slli_epi32(input[(i + 1) * instride], 2);
    output[(i + 2) * outstride] =
        _mm256_slli_epi32(input[(i + 2) * instride], 2);
    output[(i + 3) * outstride] =
        _mm256_slli_epi32(input[(i + 3) * instride], 2);
    output[(i + 4) * outstride] =
        _mm256_slli_epi32(input[(i + 4) * instride], 2);
    output[(i + 5) * outstride] =
        _mm256_slli_epi32(input[(i + 5) * instride], 2);
    output[(i + 6) * outstride] =
        _mm256_slli_epi32(input[(i + 6) * instride], 2);
    output[(i + 7) * outstride] =
        _mm256_slli_epi32(input[(i + 7) * instride], 2);
  }
}